

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockBuildSystemDelegate.h
# Opt level: O0

void __thiscall
llbuild::unittests::MockBuildSystemDelegate::commandHadNote
          (MockBuildSystemDelegate *this,Command *command,StringRef data)

{
  Twine local_e0;
  Twine local_c8;
  StringRef local_b0;
  Twine local_a0;
  Twine local_88;
  Twine local_70;
  string local_58;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  Command *command_local;
  MockBuildSystemDelegate *this_local;
  StringRef data_local;
  
  data_local.Data = (char *)data.Length;
  this_local = (MockBuildSystemDelegate *)data.Data;
  if ((this->trackAllMessages & 1U) != 0) {
    lock._8_8_ = command;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_38,&this->messagesMutex);
    local_b0 = buildsystem::Command::getName((Command *)lock._8_8_);
    llvm::operator+(&local_a0,"commandNote(",&local_b0);
    llvm::Twine::Twine(&local_c8,") ");
    llvm::operator+(&local_88,&local_a0,&local_c8);
    llvm::Twine::Twine(&local_e0,(StringRef *)&this_local);
    llvm::operator+(&local_70,&local_88,&local_e0);
    llvm::Twine::str_abi_cxx11_(&local_58,&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->messages,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  }
  return;
}

Assistant:

virtual void commandHadNote(Command* command, StringRef data) {
    if (trackAllMessages) {
      std::unique_lock<std::mutex> lock(messagesMutex);
      messages.push_back(("commandNote(" + command->getName() + ") " + data).str());
    }
  }